

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall
leveldb::_Test_L0_CompactionBug_Issue44_a::_Run(_Test_L0_CompactionBug_Issue44_a *this)

{
  undefined1 local_d00 [448];
  undefined1 local_b40 [455];
  allocator local_979;
  string local_978 [39];
  allocator local_951;
  string local_950 [32];
  undefined1 local_930 [431];
  allocator local_781;
  string local_780 [32];
  undefined1 local_760 [431];
  allocator local_5b1;
  string local_5b0 [32];
  undefined1 local_590 [431];
  allocator local_3e1;
  string local_3e0 [32];
  undefined1 local_3c0 [431];
  allocator local_211;
  string local_210 [55];
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [424];
  _Test_L0_CompactionBug_Issue44_a *local_10;
  _Test_L0_CompactionBug_Issue44_a *this_local;
  
  local_10 = this;
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_1b8 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5ae);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"b",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"v",&local_211);
  DBTest::Put((DBTest *)local_1b8,(string *)this,(string *)local_1d8);
  test::Tester::IsOk((Tester *)(local_1b8 + 8),(Status *)local_1b8);
  Status::~Status((Status *)local_1b8);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  test::Tester::~Tester((Tester *)(local_1b8 + 8));
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_3c0 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"b",&local_3e1);
  DBTest::Delete((DBTest *)local_3c0,(string *)this);
  test::Tester::IsOk((Tester *)(local_3c0 + 8),(Status *)local_3c0);
  Status::~Status((Status *)local_3c0);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  test::Tester::~Tester((Tester *)(local_3c0 + 8));
  test::Tester::Tester
            ((Tester *)(local_590 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b0,"a",&local_5b1);
  DBTest::Delete((DBTest *)local_590,(string *)this);
  test::Tester::IsOk((Tester *)(local_590 + 8),(Status *)local_590);
  Status::~Status((Status *)local_590);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  test::Tester::~Tester((Tester *)(local_590 + 8));
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_760 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5b3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_780,"a",&local_781);
  DBTest::Delete((DBTest *)local_760,(string *)this);
  test::Tester::IsOk((Tester *)(local_760 + 8),(Status *)local_760);
  Status::~Status((Status *)local_760);
  std::__cxx11::string::~string(local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  test::Tester::~Tester((Tester *)(local_760 + 8));
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_930 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5b5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_950,"a",&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_978,"v",&local_979);
  DBTest::Put((DBTest *)local_930,(string *)this,(string *)local_950);
  test::Tester::IsOk((Tester *)(local_930 + 8),(Status *)local_930);
  Status::~Status((Status *)local_930);
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator((allocator<char> *)&local_979);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator((allocator<char> *)&local_951);
  test::Tester::~Tester((Tester *)(local_930 + 8));
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_b40 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5b8);
  DBTest::Contents_abi_cxx11_((DBTest *)local_b40);
  test::Tester::IsEq<char[7],std::__cxx11::string>
            ((Tester *)(local_b40 + 0x20),(char (*) [7])"(a->v)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b40);
  std::__cxx11::string::~string((string *)local_b40);
  test::Tester::~Tester((Tester *)(local_b40 + 0x20));
  anon_unknown_4::DelayMilliseconds(1000);
  test::Tester::Tester
            ((Tester *)(local_d00 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5ba);
  DBTest::Contents_abi_cxx11_((DBTest *)local_d00);
  test::Tester::IsEq<char[7],std::__cxx11::string>
            ((Tester *)(local_d00 + 0x20),(char (*) [7])"(a->v)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d00);
  std::__cxx11::string::~string((string *)local_d00);
  test::Tester::~Tester((Tester *)(local_d00 + 0x20));
  return;
}

Assistant:

TEST(DBTest, L0_CompactionBug_Issue44_a) {
  Reopen();
  ASSERT_OK(Put("b", "v"));
  Reopen();
  ASSERT_OK(Delete("b"));
  ASSERT_OK(Delete("a"));
  Reopen();
  ASSERT_OK(Delete("a"));
  Reopen();
  ASSERT_OK(Put("a", "v"));
  Reopen();
  Reopen();
  ASSERT_EQ("(a->v)", Contents());
  DelayMilliseconds(1000);  // Wait for compaction to finish
  ASSERT_EQ("(a->v)", Contents());
}